

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
despot::VNode::VNode
          (VNode *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          int depth,QNode *parent,OBS_TYPE edge)

{
  int iVar1;
  log_ostream *plVar2;
  ostream *poVar3;
  ulong uVar4;
  
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&this->particles_,particles);
  this->belief_ = (Belief *)0x0;
  this->depth_ = depth;
  this->parent_ = parent;
  this->edge_ = edge;
  (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ValuedAction::ValuedAction(&this->default_move_);
  this->vstar = this;
  this->likelihood = 1.0;
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (3 < iVar1) {
      plVar2 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar2->super_ostream,"Constructed vnode with ",0x17);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)plVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," particles",10);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      iVar1 = logging::level();
      if (0 < iVar1) {
        iVar1 = logging::level();
        if (3 < iVar1) {
          plVar2 = logging::stream(4);
          std::__ostream_insert<char,std::char_traits<char>>(&plVar2->super_ostream," ",1);
          poVar3 = (ostream *)std::ostream::operator<<(plVar2,(int)uVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
          poVar3 = despot::operator<<(poVar3,(this->particles_).
                                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar4]);
          std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->particles_).
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->particles_).
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

VNode::VNode(vector<State*>& particles, int depth, QNode* parent,
	OBS_TYPE edge) :
	particles_(particles),
	belief_(NULL),
	depth_(depth),
	parent_(parent),
	edge_(edge),
	vstar(this),
	likelihood(1) {
	logd << "Constructed vnode with " << particles_.size() << " particles"
		<< endl;
	for (int i = 0; i < particles_.size(); i++) {
		logd << " " << i << " = " << *particles_[i] << endl;
	}
}